

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::initBuffer
               (Functions *gl,GLuint seed,GLenum usage,GLuint buffer)

{
  GLenum err;
  undefined1 *puVar1;
  long lVar2;
  float fVar3;
  float afStack_70 [2];
  GLfloat data [12];
  Random rnd;
  
  puVar1 = (undefined1 *)data;
  afStack_70[0] = 2.2697976e-38;
  afStack_70[1] = 0.0;
  (*gl->bindBuffer)(0x8892,buffer);
  if (seed == 0) {
    puVar1 = Functional::(anonymous_namespace)::s_varrData;
  }
  else {
    afStack_70[0] = 2.2698006e-38;
    afStack_70[1] = 0.0;
    deRandom_init(&rnd.m_rnd,seed);
    for (lVar2 = 8; lVar2 != 0x38; lVar2 = lVar2 + 0x10) {
      afStack_70[0] = 2.2698031e-38;
      afStack_70[1] = 0.0;
      fVar3 = deRandom_getFloat(&rnd.m_rnd);
      *(float *)((long)data + lVar2 + -8) = fVar3 + -0.5 + fVar3 + -0.5;
      afStack_70[0] = 2.2698074e-38;
      afStack_70[1] = 0.0;
      fVar3 = deRandom_getFloat(&rnd.m_rnd);
      *(float *)((long)data + lVar2 + -4) = fVar3 + -0.5 + fVar3 + -0.5;
      *(undefined8 *)((long)data + lVar2) = 0x3f80000000000000;
    }
  }
  afStack_70[0] = 2.2698172e-38;
  afStack_70[1] = 0.0;
  (*gl->bufferData)(0x8892,0x30,puVar1,usage);
  afStack_70[0] = 2.2698186e-38;
  afStack_70[1] = 0.0;
  (*gl->bindBuffer)(0x8892,0);
  afStack_70[0] = 2.2698195e-38;
  afStack_70[1] = 0.0;
  err = (*gl->getError)();
  afStack_70[0] = 2.2698224e-38;
  afStack_70[1] = 0.0;
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0xfe);
  return;
}

Assistant:

void initBuffer (const Functions& gl, GLuint seed, GLenum usage, GLuint buffer)
{
	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	if (seed == 0)
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_varrData), s_varrData, usage);
	else
	{
		Random	rnd	(seed);
		GLfloat data[DE_LENGTH_OF_ARRAY(s_varrData)];

		for (int ndx = 0; ndx < NUM_VERTICES; ndx++)
		{
			GLfloat* vertex = &data[ndx * NUM_COMPONENTS];
			vertex[0] = 2.0f * (rnd.getFloat() - 0.5f);
			vertex[1] = 2.0f * (rnd.getFloat() - 0.5f);
			DE_STATIC_ASSERT(NUM_COMPONENTS == 4);
			vertex[2] = 0.0f;
			vertex[3] = 1.0f;
		}
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, usage);
	}
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}